

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkInter(Abc_Ntk_t *pNtkOn,Abc_Ntk_t *pNtkOff,int fRelation,int fVerbose)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtk_00;
  int local_54;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkInter;
  Abc_Ntk_t *pNtkInter1;
  Abc_Ntk_t *pNtkOff1;
  Abc_Ntk_t *pNtkOn1;
  int fVerbose_local;
  int fRelation_local;
  Abc_Ntk_t *pNtkOff_local;
  Abc_Ntk_t *pNtkOn_local;
  
  iVar1 = Abc_NtkCoNum(pNtkOn);
  iVar2 = Abc_NtkCoNum(pNtkOff);
  if (iVar1 == iVar2) {
    iVar1 = Abc_NtkCoNum(pNtkOn);
    if (iVar1 == 1) {
      pNtkOn_local = Abc_NtkInterOne(pNtkOn,pNtkOff,fRelation,fVerbose);
    }
    else {
      pNtkOn_local = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
      pcVar3 = Extra_UtilStrsav(pNtkOn->pName);
      pNtkOn_local->pName = pcVar3;
      for (local_54 = 0; iVar1 = Abc_NtkPiNum(pNtkOn), local_54 < iVar1; local_54 = local_54 + 1) {
        pAVar4 = Abc_NtkPi(pNtkOn,local_54);
        Abc_NtkDupObj(pNtkOn_local,pAVar4,1);
      }
      timeCnf = 0;
      timeSat = 0;
      timeInt = 0;
      for (local_54 = 0; iVar1 = Abc_NtkCoNum(pNtkOn), local_54 < iVar1; local_54 = local_54 + 1) {
        pAVar4 = Abc_NtkCo(pNtkOn,local_54);
        pAVar5 = Abc_ObjFanin0(pAVar4);
        pcVar3 = Abc_ObjName(pAVar4);
        pNtk = Abc_NtkCreateCone(pNtkOn,pAVar5,pcVar3,1);
        iVar1 = Abc_ObjFaninC0(pAVar4);
        if (iVar1 != 0) {
          pAVar4 = Abc_NtkPo(pNtk,0);
          Abc_ObjXorFaninC(pAVar4,0);
        }
        pAVar4 = Abc_NtkCo(pNtkOff,local_54);
        pAVar5 = Abc_ObjFanin0(pAVar4);
        pcVar3 = Abc_ObjName(pAVar4);
        pNtk_00 = Abc_NtkCreateCone(pNtkOff,pAVar5,pcVar3,1);
        iVar1 = Abc_ObjFaninC0(pAVar4);
        if (iVar1 != 0) {
          pAVar4 = Abc_NtkPo(pNtk_00,0);
          Abc_ObjXorFaninC(pAVar4,0);
        }
        iVar1 = Abc_NtkNodeNum(pNtk);
        if (iVar1 == 0) {
          pNtkInter = Abc_NtkDup(pNtk);
        }
        else {
          iVar1 = Abc_NtkNodeNum(pNtk_00);
          if (iVar1 == 0) {
            pNtkInter = Abc_NtkDup(pNtk_00);
            pAVar4 = Abc_NtkPo(pNtkInter,0);
            Abc_ObjXorFaninC(pAVar4,0);
          }
          else {
            pNtkInter = Abc_NtkInterOne(pNtk,pNtk_00,0,fVerbose);
          }
        }
        if (pNtkInter != (Abc_Ntk_t *)0x0) {
          Abc_NtkAppend(pNtkOn_local,pNtkInter,1);
          Abc_NtkDelete(pNtkInter);
        }
        Abc_NtkDelete(pNtk);
        Abc_NtkDelete(pNtk_00);
      }
      iVar1 = Abc_NtkCheck(pNtkOn_local);
      if (iVar1 == 0) {
        Abc_Print(1,"Abc_NtkAttachBottom(): Network check has failed.\n");
      }
    }
  }
  else {
    Abc_Print(1,"Currently works only for networks with equal number of POs.\n");
    pNtkOn_local = (Abc_Ntk_t *)0x0;
  }
  return pNtkOn_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkInter( Abc_Ntk_t * pNtkOn, Abc_Ntk_t * pNtkOff, int fRelation, int fVerbose )
{
    Abc_Ntk_t * pNtkOn1, * pNtkOff1, * pNtkInter1, * pNtkInter;
    Abc_Obj_t * pObj;
    int i; //, clk = Abc_Clock();
    if ( Abc_NtkCoNum(pNtkOn) != Abc_NtkCoNum(pNtkOff) )
    {
        Abc_Print( 1, "Currently works only for networks with equal number of POs.\n" );
        return NULL;
    }
    // compute the fast interpolation time
//    Abc_NtkInterFast( pNtkOn, pNtkOff, fVerbose );
    // consider the case of one output
    if ( Abc_NtkCoNum(pNtkOn) == 1 )
        return Abc_NtkInterOne( pNtkOn, pNtkOff, fRelation, fVerbose );
    // start the new network
    pNtkInter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkInter->pName = Extra_UtilStrsav(pNtkOn->pName);
    Abc_NtkForEachPi( pNtkOn, pObj, i )
        Abc_NtkDupObj( pNtkInter, pObj, 1 );
    // process each POs separately
timeCnf = 0;
timeSat = 0;
timeInt = 0;
    Abc_NtkForEachCo( pNtkOn, pObj, i )
    {
        pNtkOn1 = Abc_NtkCreateCone( pNtkOn, Abc_ObjFanin0(pObj), Abc_ObjName(pObj), 1 );
        if ( Abc_ObjFaninC0(pObj) )
            Abc_ObjXorFaninC( Abc_NtkPo(pNtkOn1, 0), 0 );

        pObj   = Abc_NtkCo(pNtkOff, i);
        pNtkOff1 = Abc_NtkCreateCone( pNtkOff, Abc_ObjFanin0(pObj), Abc_ObjName(pObj), 1 );
        if ( Abc_ObjFaninC0(pObj) )
            Abc_ObjXorFaninC( Abc_NtkPo(pNtkOff1, 0), 0 );

        if ( Abc_NtkNodeNum(pNtkOn1) == 0 )
            pNtkInter1 = Abc_NtkDup( pNtkOn1 );
        else if ( Abc_NtkNodeNum(pNtkOff1) == 0 )
        {
            pNtkInter1 = Abc_NtkDup( pNtkOff1 );
            Abc_ObjXorFaninC( Abc_NtkPo(pNtkInter1, 0), 0 );
        }
        else
            pNtkInter1 = Abc_NtkInterOne( pNtkOn1, pNtkOff1, 0, fVerbose );
        if ( pNtkInter1 )
        {
            Abc_NtkAppend( pNtkInter, pNtkInter1, 1 );
            Abc_NtkDelete( pNtkInter1 );
        }

        Abc_NtkDelete( pNtkOn1 );
        Abc_NtkDelete( pNtkOff1 );
    }
//    ABC_PRT( "CNF", timeCnf );
//    ABC_PRT( "SAT", timeSat );
//    ABC_PRT( "Int", timeInt );
//    ABC_PRT( "Slow interpolation time", Abc_Clock() - clk );

    // return the network
    if ( !Abc_NtkCheck( pNtkInter ) )
        Abc_Print( 1, "Abc_NtkAttachBottom(): Network check has failed.\n" );
    return pNtkInter;
}